

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

void __thiscall google::protobuf::DynamicMessage::~DynamicMessage(DynamicMessage *this)

{
  FieldDescriptor *field;
  uint uVar1;
  Descriptor *pDVar2;
  long lVar3;
  TypeInfo *pTVar4;
  once_flag *poVar5;
  __pointer_type pSVar6;
  bool bVar7;
  DynamicMessage *pDVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  Arena *pAVar12;
  long lVar13;
  RepeatedPtrFieldBase *this_00;
  long lVar14;
  FieldDescriptor *local_48;
  _func_void_FieldDescriptor_ptr *local_40;
  Descriptor *local_38;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DynamicMessage_00675ab0;
  pDVar2 = this->type_info_->type;
  internal::
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  ::~InternalMetadataWithArenaBase
            ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              *)((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                (long)this->type_info_->internal_metadata_offset));
  lVar11 = (long)this->type_info_->extensions_offset;
  if (lVar11 != -1) {
    internal::ExtensionSet::~ExtensionSet
              ((ExtensionSet *)
               ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + lVar11));
  }
  uVar1 = *(uint *)(pDVar2 + 0x68);
  uVar9 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    lVar11 = 0;
    lVar14 = 0;
    local_38 = pDVar2;
    do {
      lVar3 = *(long *)(local_38 + 0x28);
      field = (FieldDescriptor *)(lVar11 + lVar3);
      lVar13 = *(long *)(lVar3 + 0x58 + lVar11);
      pTVar4 = this->type_info_;
      if (lVar13 == 0) {
        this_00 = (RepeatedPtrFieldBase *)
                  ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                  (long)(int)(pTVar4->offsets)._M_t.
                             super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                             .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar14]);
        poVar5 = *(once_flag **)(lVar3 + 0x30 + lVar11);
        if (*(int *)(lVar3 + 0x3c + lVar11) == 3) {
          if (poVar5 != (once_flag *)0x0) {
            local_40 = FieldDescriptor::TypeOnceInit;
            local_48 = field;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (poVar5,&local_40,&local_48);
          }
          switch(*(undefined4 *)
                  (FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(lVar3 + 0x38 + lVar11) * 4)
                ) {
          case 1:
          case 8:
            RepeatedField<int>::~RepeatedField((RepeatedField<int> *)this_00);
            break;
          case 2:
            RepeatedField<long>::~RepeatedField((RepeatedField<long> *)this_00);
            break;
          case 3:
            RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)this_00);
            break;
          case 4:
            RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)this_00);
            break;
          case 5:
            RepeatedField<double>::~RepeatedField((RepeatedField<double> *)this_00);
            break;
          case 6:
            RepeatedField<float>::~RepeatedField((RepeatedField<float> *)this_00);
            break;
          case 7:
            RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)this_00);
            break;
          case 9:
            RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)this_00);
            break;
          case 10:
            bVar7 = anon_unknown_0::IsMapFieldInApi(field);
            if (bVar7) {
              (*(code *)(this_00->arena_->impl_).threads_._M_b._M_p)(this_00);
            }
            else {
              internal::RepeatedPtrFieldBase::
              Destroy<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
                        (this_00);
            }
          }
        }
        else {
          if (poVar5 != (once_flag *)0x0) {
            local_40 = FieldDescriptor::TypeOnceInit;
            local_48 = field;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (poVar5,&local_40,&local_48);
          }
          iVar10 = *(int *)(FieldDescriptor::kTypeToCppTypeMap +
                           (ulong)*(uint *)(lVar3 + 0x38 + lVar11) * 4);
          if (iVar10 == 9) {
            pDVar8 = this->type_info_->prototype;
            uVar9 = (ulong)(int)(this->type_info_->offsets)._M_t.
                                super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar14];
            pAVar12 = this_00->arena_;
            goto LAB_00305444;
          }
          poVar5 = *(once_flag **)(lVar3 + 0x30 + lVar11);
          if (poVar5 != (once_flag *)0x0) {
            local_40 = FieldDescriptor::TypeOnceInit;
            local_48 = field;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (poVar5,&local_40,&local_48);
            iVar10 = *(int *)(FieldDescriptor::kTypeToCppTypeMap +
                             (ulong)*(uint *)(lVar3 + 0x38 + lVar11) * 4);
          }
          if ((iVar10 == 10) &&
             (pDVar8 = this->type_info_->prototype,
             pDVar8 != (DynamicMessage *)0x0 && pDVar8 != this)) {
            pAVar12 = this_00->arena_;
            goto LAB_00305513;
          }
        }
      }
      else {
        iVar10 = (int)((ulong)(lVar13 - *(long *)(*(long *)(lVar13 + 0x10) + 0x30)) >> 4);
        if (*(int *)((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                    (long)(iVar10 * -0x55555554 + pTVar4->oneof_case_offset)) ==
            *(int *)(lVar3 + 0x44 + lVar11)) {
          lVar13 = (long)(int)(pTVar4->offsets)._M_t.
                              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                              .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
                              [(int)uVar9 + iVar10 * -0x55555555];
          poVar5 = *(once_flag **)(lVar3 + 0x30 + lVar11);
          if (poVar5 != (once_flag *)0x0) {
            local_40 = FieldDescriptor::TypeOnceInit;
            local_48 = field;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (poVar5,&local_40,&local_48);
          }
          iVar10 = *(int *)(FieldDescriptor::kTypeToCppTypeMap +
                           (ulong)*(uint *)(lVar3 + 0x38 + lVar11) * 4);
          if (iVar10 == 9) {
            pDVar8 = this->type_info_->prototype;
            uVar9 = (ulong)(this->type_info_->offsets)._M_t.
                           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                           .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar14];
            pAVar12 = *(Arena **)
                       ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + lVar13);
LAB_00305444:
            if (pAVar12 !=
                *(Arena **)
                 ((long)&(pDVar8->super_Message).super_MessageLite._vptr_MessageLite + uVar9)) {
              if ((pAVar12 != (Arena *)0x0) &&
                 (pSVar6 = (pAVar12->impl_).threads_._M_b._M_p,
                 pSVar6 != (__pointer_type)&(pAVar12->impl_).space_allocated_)) {
                operator_delete(pSVar6);
              }
              operator_delete(pAVar12);
            }
          }
          else {
            poVar5 = *(once_flag **)(lVar3 + 0x30 + lVar11);
            if (poVar5 != (once_flag *)0x0) {
              local_40 = FieldDescriptor::TypeOnceInit;
              local_48 = field;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (poVar5,&local_40,&local_48);
              iVar10 = *(int *)(FieldDescriptor::kTypeToCppTypeMap +
                               (ulong)*(uint *)(lVar3 + 0x38 + lVar11) * 4);
            }
            if (iVar10 == 10) {
              pAVar12 = *(Arena **)
                         ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + lVar13)
              ;
LAB_00305513:
              if (pAVar12 != (Arena *)0x0) {
                (*(code *)((pAVar12->impl_).threads_._M_b._M_p)->owner_)();
              }
            }
          }
        }
      }
      lVar14 = lVar14 + 1;
      uVar9 = (ulong)*(int *)(local_38 + 0x68);
      lVar11 = lVar11 + 0x98;
    } while (lVar14 < (long)uVar9);
  }
  return;
}

Assistant:

DynamicMessage::~DynamicMessage() {
  const Descriptor* descriptor = type_info_->type;

  reinterpret_cast<InternalMetadataWithArena*>(
      OffsetToPointer(type_info_->internal_metadata_offset))
      ->~InternalMetadataWithArena();

  if (type_info_->extensions_offset != -1) {
    reinterpret_cast<ExtensionSet*>(
        OffsetToPointer(type_info_->extensions_offset))
        ->~ExtensionSet();
  }

  // We need to manually run the destructors for repeated fields and strings,
  // just as we ran their constructors in the DynamicMessage constructor.
  // We also need to manually delete oneof fields if it is set and is string
  // or message.
  // Additionally, if any singular embedded messages have been allocated, we
  // need to delete them, UNLESS we are the prototype message of this type,
  // in which case any embedded messages are other prototypes and shouldn't
  // be touched.
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    if (field->containing_oneof()) {
      void* field_ptr =
          OffsetToPointer(type_info_->oneof_case_offset +
                          sizeof(uint32) * field->containing_oneof()->index());
      if (*(reinterpret_cast<const uint32*>(field_ptr)) == field->number()) {
        field_ptr = OffsetToPointer(
            type_info_->offsets[descriptor->field_count() +
                                field->containing_oneof()->index()]);
        if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
          switch (field->options().ctype()) {
            default:
            case FieldOptions::STRING: {
              const std::string* default_value =
                  &(reinterpret_cast<const ArenaStringPtr*>(
                        reinterpret_cast<const uint8*>(type_info_->prototype) +
                        type_info_->offsets[i])
                        ->Get());
              reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy(
                  default_value, NULL);
              break;
            }
          }
        } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            delete *reinterpret_cast<Message**>(field_ptr);
        }
      }
      continue;
    }
    void* field_ptr = OffsetToPointer(type_info_->offsets[i]);

    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                  \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:               \
    reinterpret_cast<RepeatedField<LOWERCASE>*>(field_ptr) \
        ->~RepeatedField<LOWERCASE>();                     \
    break

        HANDLE_TYPE(INT32, int32);
        HANDLE_TYPE(INT64, int64);
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE(FLOAT, float);
        HANDLE_TYPE(BOOL, bool);
        HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              reinterpret_cast<RepeatedPtrField<std::string>*>(field_ptr)
                  ->~RepeatedPtrField<std::string>();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            reinterpret_cast<DynamicMapField*>(field_ptr)->~DynamicMapField();
          } else {
            reinterpret_cast<RepeatedPtrField<Message>*>(field_ptr)
                ->~RepeatedPtrField<Message>();
          }
          break;
      }

    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      switch (field->options().ctype()) {
        default:  // TODO(kenton):  Support other string reps.
        case FieldOptions::STRING: {
          const std::string* default_value =
              &(reinterpret_cast<const ArenaStringPtr*>(
                    type_info_->prototype->OffsetToPointer(
                        type_info_->offsets[i]))
                    ->Get());
          reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy(default_value,
                                                                NULL);
          break;
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          if (!is_prototype()) {
        Message* message = *reinterpret_cast<Message**>(field_ptr);
        if (message != NULL) {
          delete message;
        }
      }
    }
  }
}